

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

void __thiscall QTableModel::setColumnCount(QTableModel *this,int columns)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (int)(this->horizontalHeaderItems).d.size;
  if (iVar1 != columns && -1 < columns) {
    if (iVar1 < columns) {
      iVar3 = 0;
      if (0 < iVar1) {
        iVar3 = iVar1;
      }
      (**(code **)(*(long *)this + 0x100))(this,iVar3,columns - iVar1);
    }
    else {
      (**(code **)(*(long *)this + 0x110))(this,columns);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableModel::setColumnCount(int columns)
{
    int cc = horizontalHeaderItems.size();
    if (columns < 0 || cc == columns)
        return;
    if (cc < columns)
        insertColumns(qMax(cc, 0), columns - cc);
    else
        removeColumns(qMax(columns, 0), cc - columns);
}